

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_lexer.cpp
# Opt level: O3

bool __thiscall Lexer::parseStringLiteral(Lexer *this,bool raw_string,int open_char)

{
  pointer *ppTVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  iterator iVar5;
  char *error;
  bool bVar6;
  iterator __position;
  int iVar7;
  byte bVar8;
  string hex;
  string tok;
  Token local_78;
  int local_58;
  int local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  this->insideString = true;
  iVar7 = this->curLine;
  local_58 = this->curColumn;
  uVar3 = nextChar(this);
  while( true ) {
    if ((uVar3 == 0) || (this->ctx->isError != false)) goto LAB_0010bc64;
    if (uVar3 == open_char) break;
    if ((char)uVar3 == '\n') {
LAB_0010ba08:
      if (!raw_string) {
        CompilationContext::error
                  (this->ctx,0x65,"end of line inside string literal",this->curLine,this->curColumn)
        ;
        this->insideString = false;
        goto LAB_0010bd6c;
      }
      if (uVar3 == 0xd) {
        iVar4 = this->index;
        if (((-1 < (long)iVar4) && (iVar4 < (int)this->s->_M_string_length)) &&
           ((this->s->_M_dataplus)._M_p[iVar4] == '\n')) {
          nextChar(this);
        }
      }
    }
    else if ((uVar3 & 0xff) == 0x5c) {
      if (!raw_string) {
        iVar4 = nextChar(this);
        if (iVar4 < 0x62) {
          if (iVar4 < 0x55) {
            if ((iVar4 != 0x22) && ((iVar4 != 0x27 && (iVar4 != 0x30))))
            goto switchD_0010babc_caseD_6f;
          }
          else {
            if (iVar4 == 0x55) goto switchD_0010babc_caseD_75;
            if ((iVar4 != 0x5c) && (iVar4 != 0x61)) goto switchD_0010babc_caseD_6f;
          }
        }
        else {
          switch(iVar4) {
          case 0x6e:
            break;
          case 0x6f:
          case 0x70:
          case 0x71:
          case 0x73:
          case 0x77:
switchD_0010babc_caseD_6f:
            error = "unrecognised escaper char";
            iVar7 = 0x67;
            goto LAB_0010bd5c;
          case 0x72:
            break;
          case 0x74:
            break;
          case 0x75:
          case 0x78:
switchD_0010babc_caseD_75:
            local_78._0_8_ = &local_78.u;
            local_78._8_8_ = 0;
            local_78.u.i = local_78.u.i & 0xffffffffffffff00;
            iVar2 = this->index;
            local_54 = iVar7;
            if ((((long)iVar2 < 0) || ((int)this->s->_M_string_length <= iVar2)) ||
               (bVar8 = (this->s->_M_dataplus)._M_p[iVar2], bVar8 == 0)) {
LAB_0010bbc0:
              CompilationContext::error
                        (this->ctx,0x66,"hexadecimal number expected",this->curLine,this->curColumn)
              ;
            }
            else {
              iVar7 = 0x7fffffff;
              if (iVar4 == 0x75) {
                iVar7 = 4;
              }
              if (iVar4 == 0x55) {
                iVar7 = 8;
              }
              iVar7 = iVar7 + 1;
              while (iVar4 = isxdigit((uint)bVar8), iVar4 != 0) {
                std::__cxx11::string::push_back((char)&local_78);
                nextChar(this);
                iVar7 = iVar7 + -1;
                if (iVar7 < 2) break;
                iVar4 = this->index;
                if ((((long)iVar4 < 0) || ((int)this->s->_M_string_length <= iVar4)) ||
                   (bVar8 = (this->s->_M_dataplus)._M_p[iVar4], bVar8 == 0)) break;
              }
              if (local_78._8_8_ == 0) goto LAB_0010bbc0;
              strtoull((char *)local_78._0_8_,(char **)0x0,0x10);
            }
            iVar7 = local_54;
            if ((U *)local_78._0_8_ != &local_78.u) {
              operator_delete((void *)local_78._0_8_);
            }
            break;
          case 0x76:
            break;
          default:
            if ((iVar4 != 0x62) && (iVar4 != 0x66)) goto switchD_0010babc_caseD_6f;
          }
        }
      }
    }
    else if ((uVar3 & 0xff) == 0xd) goto LAB_0010ba08;
LAB_0010ba52:
    std::__cxx11::string::push_back((char)&local_50);
    uVar3 = nextChar(this);
  }
  if (raw_string) {
    iVar4 = this->index;
    if (((-1 < (long)iVar4) && (iVar4 < (int)this->s->_M_string_length)) &&
       ((this->s->_M_dataplus)._M_p[iVar4] == '\"')) {
      nextChar(this);
      goto LAB_0010ba52;
    }
  }
  this->insideString = false;
LAB_0010bc64:
  if (open_char == 0x27) {
    if (local_50._M_string_length == 0) {
      error = "empty constant";
      iVar7 = 0x68;
    }
    else {
      if (local_50._M_string_length == 1) {
        local_78.u.i._1_7_ = 0;
        local_78.u.i._0_1_ = *local_50._M_dataplus._M_p;
        local_78.column = (short)local_58;
        local_78._0_6_ = 4;
        local_78.line = iVar7;
        __position._M_current =
             (this->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current !=
            (this->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_0010bd18;
        std::vector<Token,_std::allocator<Token>_>::_M_realloc_insert<Token>
                  (&this->tokens,__position,&local_78);
        goto LAB_0010bd3e;
      }
      error = "constant is too long";
      iVar7 = 0x69;
    }
LAB_0010bd5c:
    CompilationContext::error(this->ctx,iVar7,error,this->curLine,this->curColumn);
LAB_0010bd6c:
    bVar6 = false;
  }
  else {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->ctx->stringList,&local_50);
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->ctx->stringList)._M_t,&local_50);
    local_78.u = *(U *)(iVar5._M_node + 1);
    local_78.column = (short)local_58;
    local_78._0_6_ = 3;
    local_78.line = iVar7;
    __position._M_current =
         (this->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Token,_std::allocator<Token>_>::_M_realloc_insert<Token>
                (&this->tokens,__position,&local_78);
    }
    else {
LAB_0010bd18:
      (__position._M_current)->u = local_78.u;
      (__position._M_current)->type = local_78.type;
      (__position._M_current)->nextEol = local_78.nextEol;
      (__position._M_current)->nextSpace = local_78.nextSpace;
      (__position._M_current)->column = local_78.column;
      (__position._M_current)->line = local_78.line;
      *(undefined4 *)&(__position._M_current)->field_0xc = local_78._12_4_;
      ppTVar1 = &(this->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppTVar1 = *ppTVar1 + 1;
    }
LAB_0010bd3e:
    bVar6 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return bVar6;
}

Assistant:

bool Lexer::parseStringLiteral(bool raw_string, int open_char)
{
  std::string tok;
  insideString = true;
  int beginColumn = curColumn;
  int beginLine = curLine;
  int ch = 0;

  for (ch = nextChar(); ch > 0 && !ctx.isError; ch = nextChar())
  {
    if (ch == open_char)
    {
      if (raw_string && fetchChar() == '\"')
      {
        ch = nextChar();
      }
      else
      {
        insideString = false;
        break;
      }
    }
    else if (ch == 0x0d || ch == 0x0a)
    {
      if (!raw_string)
      {
        ctx.error(101, "end of line inside string literal", curLine, curColumn);
        insideString = false;
        return false;
      }

      if (ch == 0x0d && fetchChar() == 0x0a)
      {
        nextChar();
        ch = '\n';
      }
    }
    else if (ch == '\\' && !raw_string)
    {
      ch = nextChar();
      switch (ch)
      {
      case '\\': ch = '\\'; break;
      case 'a': ch = '\a'; break;
      case 'b': ch = '\b'; break;
      case 'n': ch = '\n'; break;
      case 'r': ch = '\r'; break;
      case 'v': ch = '\v'; break;
      case 't': ch = '\t'; break;
      case 'f': ch = '\f'; break;
      case '0': ch = '\0'; break;
      case '\"': ch = '\"'; break;
      case '\'': ch = '\''; break;
      case 'x':
      case 'u':
      case 'U':
      {
        int digitsLimit = INT_MAX;
        if (ch == 'u')
          digitsLimit = 4;
        if (ch == 'U')
          digitsLimit = 8;

        std::string hex;

        for (ch = fetchChar(); ch > 0; ch = fetchChar())
        {
          if (!isxdigit(ch))
            break;
          hex += char(ch);
          nextChar();

          digitsLimit--;
          if (digitsLimit <= 0)
            break;
        }

        if (hex.empty())
        {
          ctx.error(102, "hexadecimal number expected", curLine, curColumn);
          break;
        }

        ch = (int)strtoull(hex.c_str(), nullptr, 16);
      }
      break;

      default:
        ctx.error(103, "unrecognised escaper char", curLine, curColumn);
        return false;
      }
    }

    tok += char(ch);
  }

  if (open_char == '\'')
  {
    if (tok.empty())
    {
      ctx.error(104, "empty constant", curLine, curColumn);
      return false;
    }

    if (tok.length() > 1)
    {
      ctx.error(105, "constant is too long", curLine, curColumn);
      return false;
    }

    Token::U u;
    u.i = (unsigned char)tok[0];
    tokens.push_back({ (TokenType)TK_INTEGER, false, false, (unsigned short)beginColumn, beginLine, u });
  }
  else
  {
    ctx.stringList.insert(tok);
    auto listIt = ctx.stringList.find(tok);
    Token::U u;
    u.s = listIt->c_str();
    tokens.push_back({ (TokenType)TK_STRING_LITERAL, false, false, (unsigned short)beginColumn, beginLine, u });
  }

  return true;
}